

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O3

complex2 *
boost::ext::di::v1_3_0::scopes::instance::
scope<boost::ext::di::v1_3_0::aux::type_list<complex2>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>,_boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_std::shared_ptr<complex2>_>_>,_int>
::
injector_impl<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_const_int_&,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::detail::injector<boost::ext::di::v1_3_0::config,_int,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::aux::type_list<complex1>,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex1>_>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>_>
::
create<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
::impl(complex2 *__return_storage_ptr__,
      injector__<boost::ext::di::v1_3_0::named<boost::ext::di::v1_3_0::no_name,_complex2>_> *object)

{
  int iVar1;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  iVar1 = *(int *)object[3].f;
  (**(code **)object[4].f)(&local_28);
  __return_storage_ptr__->i = iVar1;
  (__return_storage_ptr__->c1).i1_.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  (__return_storage_ptr__->c1).i1_.super___shared_ptr<i1,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Stack_20;
  return __return_storage_ptr__;
}

Assistant:

static T impl(const injector__<named<TName, T>>* object) {
          using type = aux::type<aux::conditional_t<aux::is_same<TName, no_name>::value, T, named<TName, T>>>;
          return static_cast<const core::injector__<TInjector>&>(static_cast<const injector_impl*>(object)->injector_)
              .create_successful_impl(type{});
        }